

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ExprAdvanceto(Fts5IndexIter *pIter,int bDesc,i64 *piLast,int *pRc,int *pbEof)

{
  long iMatch;
  int iVar1;
  long lStack_48;
  int rc;
  i64 iRowid;
  i64 iLast;
  int *pbEof_local;
  int *pRc_local;
  i64 *piLast_local;
  int bDesc_local;
  Fts5IndexIter *pIter_local;
  
  iMatch = *piLast;
  lStack_48 = pIter->iRowid;
  if (((bDesc == 0) && (lStack_48 < iMatch)) || ((bDesc != 0 && (iMatch < lStack_48)))) {
    iVar1 = sqlite3Fts5IterNextFrom(pIter,iMatch);
    if ((iVar1 != 0) || (pIter->bEof != '\0')) {
      *pRc = iVar1;
      *pbEof = 1;
      return 1;
    }
    lStack_48 = pIter->iRowid;
  }
  *piLast = lStack_48;
  return 0;
}

Assistant:

static int fts5ExprAdvanceto(
  Fts5IndexIter *pIter,           /* Iterator to advance */
  int bDesc,                      /* True if iterator is "rowid DESC" */
  i64 *piLast,                    /* IN/OUT: Lastest rowid seen so far */
  int *pRc,                       /* OUT: Error code */
  int *pbEof                      /* OUT: Set to true if EOF */
){
  i64 iLast = *piLast;
  i64 iRowid;

  iRowid = pIter->iRowid;
  if( (bDesc==0 && iLast>iRowid) || (bDesc && iLast<iRowid) ){
    int rc = sqlite3Fts5IterNextFrom(pIter, iLast);
    if( rc || sqlite3Fts5IterEof(pIter) ){
      *pRc = rc;
      *pbEof = 1;
      return 1;
    }
    iRowid = pIter->iRowid;
    assert( (bDesc==0 && iRowid>=iLast) || (bDesc==1 && iRowid<=iLast) );
  }
  *piLast = iRowid;

  return 0;
}